

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transient_suppressor.cc
# Opt level: O3

void __thiscall
webrtc::TransientSuppressor::UpdateKeypress(TransientSuppressor *this,bool key_pressed)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  undefined7 in_register_00000031;
  LogMessage local_190;
  
  iVar2 = this->keypress_counter_;
  if ((int)CONCAT71(in_register_00000031,key_pressed) != 0) {
    iVar2 = iVar2 + 100;
    this->keypress_counter_ = iVar2;
    this->chunks_since_keypress_ = 0;
    this->detection_enabled_ = true;
  }
  iVar3 = 1;
  if (1 < iVar2) {
    iVar3 = iVar2;
  }
  this->keypress_counter_ = iVar3 - 1U;
  if (100 < iVar3 - 1U) {
    if (this->suppression_enabled_ == false) {
      bVar1 = LogMessage::Loggable(LS_INFO);
      if (bVar1) {
        LogMessage::LogMessage
                  (&local_190,
                   "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/transient/transient_suppressor.cc"
                   ,0x12a,LS_INFO);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_190,"[ts] Transient suppression is now enabled.",0x2a);
        LogMessage::~LogMessage(&local_190);
      }
    }
    this->suppression_enabled_ = true;
    this->keypress_counter_ = 0;
  }
  if ((this->detection_enabled_ == true) &&
     (iVar2 = this->chunks_since_keypress_, this->chunks_since_keypress_ = iVar2 + 1, 399 < iVar2))
  {
    if (this->suppression_enabled_ == true) {
      bVar1 = LogMessage::Loggable(LS_INFO);
      if (bVar1) {
        LogMessage::LogMessage
                  (&local_190,
                   "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/transient/transient_suppressor.cc"
                   ,0x133,LS_INFO);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_190,"[ts] Transient suppression is now disabled.",0x2b);
        LogMessage::~LogMessage(&local_190);
      }
    }
    this->detection_enabled_ = false;
    this->suppression_enabled_ = false;
    this->keypress_counter_ = 0;
  }
  return;
}

Assistant:

void TransientSuppressor::UpdateKeypress(bool key_pressed) {
  const int kKeypressPenalty = 1000 / ts::kChunkSizeMs;
  const int kIsTypingThreshold = 1000 / ts::kChunkSizeMs;
  const int kChunksUntilNotTyping = 4000 / ts::kChunkSizeMs;  // 4 seconds.

  if (key_pressed) {
    keypress_counter_ += kKeypressPenalty;
    chunks_since_keypress_ = 0;
    detection_enabled_ = true;
  }
  keypress_counter_ = std::max(0, keypress_counter_ - 1);

  if (keypress_counter_ > kIsTypingThreshold) {
    if (!suppression_enabled_) {
      LOG(LS_INFO) << "[ts] Transient suppression is now enabled.";
    }
    suppression_enabled_ = true;
    keypress_counter_ = 0;
  }

  if (detection_enabled_ &&
      ++chunks_since_keypress_ > kChunksUntilNotTyping) {
    if (suppression_enabled_) {
      LOG(LS_INFO) << "[ts] Transient suppression is now disabled.";
    }
    detection_enabled_ = false;
    suppression_enabled_ = false;
    keypress_counter_ = 0;
  }
}